

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_Base64.cc
# Opt level: O1

void __thiscall Pl_Base64::flush_decode(Pl_Base64 *this)

{
  uchar uVar1;
  byte bVar2;
  Pipeline *pPVar3;
  undefined8 uVar4;
  int iVar5;
  runtime_error *prVar6;
  long *plVar7;
  byte bVar8;
  long *plVar9;
  uint uVar10;
  type ii;
  long lVar11;
  int iVar12;
  uchar out [3];
  undefined8 local_60;
  long local_58;
  long local_50;
  long lStack_48;
  string local_40;
  
  uVar4 = local_60;
  if (this->end_of_data != false) {
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    Pipeline::getIdentifier_abi_cxx11_(&local_40,&this->super_Pipeline);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_40);
    local_60 = (long *)*plVar7;
    plVar9 = plVar7 + 2;
    if (local_60 == plVar9) {
      local_50 = *plVar9;
      lStack_48 = plVar7[3];
      local_60 = &local_50;
    }
    else {
      local_50 = *plVar9;
    }
    local_58 = plVar7[1];
    *plVar7 = (long)plVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    std::runtime_error::runtime_error(prVar6,(string *)&local_60);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar1 = this->buf[3];
  bVar8 = 0x12;
  lVar11 = 0;
  uVar10 = 0;
  iVar5 = 0;
  do {
    bVar2 = this->buf[lVar11];
    iVar12 = (int)(char)bVar2;
    if ((byte)(bVar2 + 0xbf) < 0x1a) {
      iVar12 = iVar12 + -0x41;
    }
    else if ((byte)(bVar2 + 0x9f) < 0x1a) {
      iVar12 = iVar12 + -0x47;
    }
    else if ((byte)(bVar2 - 0x30) < 10) {
      iVar12 = iVar12 + 4;
    }
    else if (bVar2 < 0x2f) {
      iVar12 = 0x3e;
      if ((bVar2 != 0x2b) && (bVar2 != 0x2d)) {
LAB_001329fd:
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        Pipeline::getIdentifier_abi_cxx11_(&local_40,&this->super_Pipeline);
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_40);
        local_60 = (long *)*plVar7;
        plVar9 = plVar7 + 2;
        if (local_60 == plVar9) {
          local_50 = *plVar9;
          lStack_48 = plVar7[3];
          local_60 = &local_50;
        }
        else {
          local_50 = *plVar9;
        }
        local_58 = plVar7[1];
        *plVar7 = (long)plVar9;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        std::runtime_error::runtime_error(prVar6,(string *)&local_60);
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    else if ((bVar2 == 0x2f) || (bVar2 == 0x5f)) {
      iVar12 = 0x3f;
    }
    else {
      if ((bVar2 != 0x3d) || ((lVar11 != 3 && ((lVar11 != 2 || (uVar1 != '='))))))
      goto LAB_001329fd;
      iVar5 = iVar5 + 1;
      this->end_of_data = true;
      iVar12 = 0;
    }
    uVar10 = uVar10 | iVar12 << (bVar8 & 0x1f);
    bVar8 = bVar8 - 6;
    lVar11 = lVar11 + 1;
    if (lVar11 == 4) {
      local_60._3_5_ = SUB85(uVar4,3);
      local_60._0_3_ = CONCAT12((char)uVar10,CONCAT11((char)(uVar10 >> 8),(char)(uVar10 >> 0x10)));
      pPVar3 = (this->super_Pipeline).next_;
      if (3 < iVar5) {
        QIntC::IntConverter<int,_unsigned_long,_true,_false>::error(3 - iVar5);
      }
      (*pPVar3->_vptr_Pipeline[2])(pPVar3,&local_60,(long)(3 - iVar5));
      return;
    }
  } while( true );
}

Assistant:

void
Pl_Base64::flush_decode()
{
    if (this->end_of_data) {
        throw std::runtime_error(getIdentifier() + ": base64 decode: data follows pad characters");
    }
    int pad = 0;
    int shift = 18;
    int outval = 0;
    for (size_t i = 0; i < 4; ++i) {
        int v = 0;
        char ch = to_c(this->buf[i]);
        if ((ch >= 'A') && (ch <= 'Z')) {
            v = ch - 'A';
        } else if ((ch >= 'a') && (ch <= 'z')) {
            v = ch - 'a' + 26;
        } else if ((ch >= '0') && (ch <= '9')) {
            v = ch - '0' + 52;
        } else if ((ch == '+') || (ch == '-')) {
            v = 62;
        } else if ((ch == '/') || (ch == '_')) {
            v = 63;
        } else if ((ch == '=') && ((i == 3) || ((i == 2) && (this->buf[3] == '=')))) {
            ++pad;
            this->end_of_data = true;
            v = 0;
        } else {
            throw std::runtime_error(getIdentifier() + ": base64 decode: invalid input");
        }
        outval |= v << shift;
        shift -= 6;
    }
    unsigned char out[3] = {
        to_uc(outval >> 16),
        to_uc(0xff & (outval >> 8)),
        to_uc(0xff & outval),
    };

    next()->write(out, QIntC::to_size(3 - pad));
}